

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

QString * __thiscall
QAccessibleLineEdit::text
          (QString *__return_storage_ptr__,QAccessibleLineEdit *this,int startOffset,int endOffset)

{
  EchoMode EVar1;
  QLineEdit *pQVar2;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (startOffset <= endOffset) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar2 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
    EVar1 = QLineEdit::echoMode(pQVar2);
    if (EVar1 == Normal) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar2 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
      QLineEdit::text(&local_40,pQVar2);
      QString::mid((longlong)__return_storage_ptr__,(longlong)&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
      goto LAB_0052558f;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_0052558f:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleLineEdit::text(int startOffset, int endOffset) const
{
    if (startOffset > endOffset)
        return QString();

    if (lineEdit()->echoMode() != QLineEdit::Normal)
        return QString();

    return lineEdit()->text().mid(startOffset, endOffset - startOffset);
}